

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void vkt::memory::(anonymous_namespace)::
     removeFirstEqual<vkt::memory::(anonymous_namespace)::MemoryObject*>
               (vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
                *vec,MemoryObject_conflict **val)

{
  value_type pMVar1;
  size_type sVar2;
  reference ppMVar3;
  ulong local_20;
  size_t ndx;
  MemoryObject_conflict **val_local;
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  *vec_local;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::
            vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
            ::size(vec);
    if (sVar2 <= local_20) {
      return;
    }
    ppMVar3 = std::
              vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
              ::operator[](vec,local_20);
    if (*ppMVar3 == *val) break;
    local_20 = local_20 + 1;
  }
  ppMVar3 = std::
            vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
            ::back(vec);
  pMVar1 = *ppMVar3;
  ppMVar3 = std::
            vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
            ::operator[](vec,local_20);
  *ppMVar3 = pMVar1;
  std::
  vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>
  ::pop_back(vec);
  return;
}

Assistant:

void removeFirstEqual (vector<T>& vec, const T& val)
{
	for (size_t ndx = 0; ndx < vec.size(); ndx++)
	{
		if (vec[ndx] == val)
		{
			vec[ndx] = vec.back();
			vec.pop_back();
			return;
		}
	}
}